

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O0

void __thiscall cppnet::BlockMemoryPool::~BlockMemoryPool(BlockMemoryPool *this)

{
  BlockMemoryPool *this_local;
  
  ~BlockMemoryPool(this);
  operator_delete(this);
  return;
}

Assistant:

BlockMemoryPool::~BlockMemoryPool() {
#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    // free all memory
    for (auto iter = _free_mem_vec.begin(); iter != _free_mem_vec.end(); ++iter) {
        free(*iter);
    }
    _free_mem_vec.clear();
}